

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

void __thiscall
argvParser::argvParser
          (argvParser *this,string *applicationNam_,string *description_,bool addDefaultHelpCommand_
          ,string *commentToken_)

{
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar1;
  section *this_00;
  section *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [48];
  string *local_30;
  string *commentToken__local;
  string *psStack_20;
  bool addDefaultHelpCommand__local;
  string *description__local;
  string *applicationNam__local;
  argvParser *this_local;
  
  local_30 = commentToken_;
  commentToken__local._7_1_ = addDefaultHelpCommand_;
  psStack_20 = description_;
  description__local = applicationNam_;
  applicationNam__local = (string *)this;
  argParserAdvancedConfiguration::argParserAdvancedConfiguration
            (&this->super_argParserAdvancedConfiguration);
  std::__cxx11::string::string((string *)&this->commentToken);
  std::__cxx11::string::string((string *)&this->description);
  this->analyseArgvNotJetRun = true;
  std::__cxx11::string::string((string *)&this->nameOfDefaultConfigFile);
  std::__cxx11::string::string((string *)&this->defaultConfigFilesLocations);
  std::__cxx11::string::operator=
            ((string *)&(this->super_argParserAdvancedConfiguration).applicationName,
             (string *)applicationNam_);
  std::operator+(local_60,(char *)description_);
  std::__cxx11::string::operator=((string *)&this->description,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  this->addHelp = (bool)(commentToken__local._7_1_ & 1);
  std::__cxx11::string::operator=((string *)&this->commentToken,(string *)commentToken_);
  pvVar1 = (vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            *)operator_new(0x18);
  (pvVar1->
  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->
  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  ::vector(pvVar1);
  (this->super_argParserAdvancedConfiguration).newargconfig = pvVar1;
  pvVar1 = (this->super_argParserAdvancedConfiguration).newargconfig;
  this_00 = (section *)operator_new(0x28);
  *(undefined8 *)&this_00->field_0x10 = 0;
  *(undefined8 *)&this_00->field_0x18 = 0;
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  this_00->arguments =
       (vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
        *)0x0;
  argParserAdvancedConfiguration::section::section(this_00);
  local_68 = this_00;
  std::
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  ::push_back(pvVar1,&local_68);
  return;
}

Assistant:

argvParser::argvParser(string applicationNam_, string description_, bool addDefaultHelpCommand_, string commentToken_) {
    applicationName = applicationNam_;
    description = description_ + "\n";
    addHelp = addDefaultHelpCommand_;
    commentToken = commentToken_;
    newargconfig = new vector<section*>();
    newargconfig->push_back(new section());
}